

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O2

void print_voice_list(OpenJTalk *openjtalk)

{
  undefined8 *puVar1;
  size_t sVar2;
  HtsVoiceFilelist *list_1;
  long lVar3;
  ulong uVar4;
  HtsVoiceFilelist *list;
  undefined8 *puVar5;
  char padding [260];
  char local_138 [272];
  
  puVar1 = (undefined8 *)openjtalk_getHTSVoiceList();
  uVar4 = 0;
  for (puVar5 = puVar1; puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)*puVar5) {
    sVar2 = strlen((char *)puVar5[2]);
    if (uVar4 <= sVar2) {
      uVar4 = sVar2;
    }
  }
  for (; puVar1 != (undefined8 *)0x0; puVar1 = (undefined8 *)*puVar1) {
    sVar2 = strlen((char *)puVar1[2]);
    local_138[0] = ' ';
    local_138[1] = '\0';
    for (lVar3 = sVar2 + (uVar4 & 0xfffffffffffffffc ^ 0xfffffffffffffffd); lVar3 != 0;
        lVar3 = lVar3 + 1) {
      sVar2 = strlen(local_138);
      (local_138 + sVar2)[0] = ' ';
      (local_138 + sVar2)[1] = '\0';
    }
    printf("%s%s%s\n",puVar1[2],local_138,puVar1[1]);
  }
  return;
}

Assistant:

void print_voice_list(OpenJTalk *openjtalk)
{
	char padding[MAX_PATH];
	HtsVoiceFilelist *result = openjtalk_getHTSVoiceList(openjtalk);
	size_t length = 0;

	for (HtsVoiceFilelist*list = result; list != NULL; list = list->succ)
	{
		size_t len = strlen(list->name);
		if (length < len)
		{
			length = len;
		}
	}
	int tab_len = 4;
	length = (length / tab_len) * tab_len + tab_len;
	for (HtsVoiceFilelist*list = result; list != NULL; list = list->succ)
	{
		size_t diff = length - strlen((char*)list->name);
		strcpy(padding, " ");
		while (--diff)
		{
			strcat(padding, " ");
		}
		printf("%s%s%s\n", (char*)list->name, padding, (char*)list->path);
	}
}